

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O0

void __thiscall
unodb::test::
tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::insert_key_range_internal
          (tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,key_type start_key,size_t count,bool bypass_verifier)

{
  value_view v;
  key_encoder *pkVar1;
  size_type sVar2;
  const_reference pvVar3;
  key_view k;
  ulong local_180;
  uint64_t key;
  key_encoder enc;
  uint64_t start_key_dec;
  undefined1 local_48 [8];
  key_decoder dec;
  bool bypass_verifier_local;
  size_t count_local;
  tree_verifier<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  key_type start_key_local;
  
  dec.off._7_1_ = bypass_verifier;
  key_decoder::key_decoder((key_decoder *)local_48,start_key);
  key_decoder::decode((key_decoder *)local_48,&enc.off);
  key_encoder::key_encoder((key_encoder *)&key);
  for (local_180 = enc.off; local_180 < enc.off + count; local_180 = local_180 + 1) {
    pkVar1 = key_encoder::reset((key_encoder *)&key);
    pkVar1 = key_encoder::encode(pkVar1,local_180);
    k = key_encoder::get_key_view(pkVar1);
    sVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::size
                      ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)test_values
                      );
    pvVar3 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                       ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                        test_values,local_180 % sVar2);
    v._M_ptr = pvVar3->_M_ptr;
    v._M_extent._M_extent_value = (pvVar3->_M_extent)._M_extent_value;
    tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
    ::insert<std::span<std::byte_const,18446744073709551615ul>>
              ((tree_verifier<unodb::db<std::span<std::byte_const,18446744073709551615ul>,std::span<std::byte_const,18446744073709551615ul>>>
                *)this,k,v,(bool)(dec.off._7_1_ & 1));
  }
  key_encoder::~key_encoder((key_encoder *)&key);
  return;
}

Assistant:

void insert_key_range_internal(key_type start_key, std::size_t count,
                                 bool bypass_verifier = false) {
    if constexpr (std::is_same_v<key_type, key_view>) {
      // decode to figure out the start key for the loop.
      unodb::key_decoder dec(start_key);
      std::uint64_t start_key_dec;
      dec.decode(start_key_dec);
      unodb::key_encoder enc;
      for (auto key = start_key_dec; key < start_key_dec + count; ++key) {
        insert(enc.reset().encode(key).get_key_view(),
               test_values[key % test_values.size()], bypass_verifier);
      }
    } else {
      for (auto key = start_key; key < start_key + count; ++key) {
        insert(key, test_values[key % test_values.size()], bypass_verifier);
      }
    }
  }